

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O1

MPP_RET hal_vp9d_vdpu382_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  long lVar2;
  MPP_RET MVar3;
  long *plVar4;
  ulong uVar5;
  MppFrame mframe;
  MppFrame local_38;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (*(int *)((long)hal + 0x38) == 0) {
    plVar4 = (long *)(lVar1 + 0xe8);
  }
  else {
    plVar4 = (long *)((long)(task->dec).reg_index * 0x40 + lVar1 + 0x30);
  }
  lVar2 = *plVar4;
  if (lVar2 == 0) {
    _mpp_log_l(2,"hal_vp9d_vdpu382","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
               "hal_vp9d_vdpu382_wait",0x3fd);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
  if (MVar3 != MPP_OK) {
    _mpp_log_l(2,"hal_vp9d_vdpu382","poll cmd failed %d\n","hal_vp9d_vdpu382_wait",
               (ulong)(uint)MVar3);
  }
  if (((byte)hal_vp9d_debug & 4) != 0) {
    uVar5 = 0;
    do {
      _mpp_log_l(4,"hal_vp9d_vdpu382","get regs[%02d]: %08X\n",(char *)0x0,uVar5 & 0xffffffff,
                 (ulong)*(uint *)(lVar2 + uVar5 * 4));
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 != 0xaf);
  }
  if ((((ulong)(task->dec).flags & 0xc) != 0) || ((*(byte *)(lVar2 + 0x22c) & 4) == 0)) {
    local_38 = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x18),(task->dec).output,SLOT_FRAME_PTR,&local_38);
    mpp_frame_set_errinfo(local_38,1);
  }
  if (*(int *)((long)hal + 0x38) != 0) {
    *(undefined4 *)(lVar1 + (long)(task->dec).reg_index * 0x40) = 0;
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;
    Vdpu382Vp9dRegSet *hw_regs = (Vdpu382Vp9dRegSet *)hw_ctx->hw_regs;

    if (p_hal->fast_mode)
        hw_regs = (Vdpu382Vp9dRegSet *)hw_ctx->g_buf[task->dec.reg_index].hw_regs;

    mpp_assert(hw_regs);

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(Vdpu382Vp9dRegSet) / 4; i++)
            mpp_log("get regs[%02d]: %08X\n", i, *p++);
    }

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        !hw_regs->irq_status.reg224.dec_rdy_sta) {
        MppFrame mframe = NULL;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_frame_set_errinfo(mframe, 1);
    }
#if !HW_PROB
    if (p_hal->dec_cb && task->dec.flags.wait_done) {
        DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;

        mpp_buffer_sync_end(hw_ctx->count_base);
        hal_vp9d_update_counts(mpp_buffer_get_ptr(hw_ctx->count_base), task->dec.syntax.data);
        mpp_callback(p_hal->dec_cb, &pic_param->counts);
    }
#endif
    if (p_hal->fast_mode) {
        hw_ctx->g_buf[task->dec.reg_index].use_flag = 0;
    }

    (void)task;
    return ret;
}